

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.hpp
# Opt level: O3

string * __thiscall json11::Json::dump_abi_cxx11_(string *__return_storage_ptr__,Json *this)

{
  element_type *peVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  peVar1 = (this->m_ptr).super___shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_JsonValue[3])(peVar1,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string dump() const {
        std::string out;
        dump(out);
        return out;
    }